

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
baseObject::drawObject
          (baseObject *this,ostream *os,uint counter,size *_canvasOffset,size *_canvasSize)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  objectType oVar9;
  pointer p_Var10;
  pointer pbVar11;
  ostream *poVar12;
  pointer p_Var13;
  bezierPoint *it;
  pointer pbVar14;
  size_t i;
  ulong uVar15;
  point *figurePoint;
  long lVar16;
  int iVar17;
  size_t index;
  char *pcVar18;
  int iVar19;
  size_t i_1;
  int iVar20;
  int iVar21;
  double dVar22;
  double dVar23;
  point pVar24;
  size local_98;
  int local_7c;
  double local_78;
  double dStack_70;
  double local_60;
  double local_58;
  double dStack_50;
  size local_48;
  
  iVar17 = (int)(_canvasOffset->width * 360000.0);
  iVar19 = (int)(_canvasOffset->height * 360000.0);
  iVar20 = (int)(_canvasSize->width * 360000.0);
  iVar21 = (int)(_canvasSize->height * 360000.0);
  oVar9 = this->type;
  if (oVar9 != OBJECT_CLOSEDLINE) {
    if (oVar9 == OBJECT_STRAIGHTLINE) {
      p_Var10 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar1 = p_Var10[1].x;
      dVar22 = p_Var10->x;
      p_Var13 = p_Var10 + 1;
      if (p_Var10->y < p_Var10[1].y) {
        p_Var13 = p_Var10;
      }
      dVar23 = dVar22;
      if (dVar1 <= dVar22) {
        dVar23 = dVar1;
      }
      if (dVar22 <= dVar1) {
        dVar22 = dVar1;
      }
      dVar1 = p_Var13->y;
      p_Var13 = p_Var10 + 1;
      if (p_Var10[1].y < p_Var10->y) {
        p_Var13 = p_Var10;
      }
      dVar2 = p_Var13->y;
      local_78 = (double)CONCAT44(local_78._4_4_,counter);
      local_58 = (double)iVar20;
      dStack_50 = (double)iVar21;
      local_98.width = dVar23;
      local_98.height = dVar1;
      local_7c = iVar19;
      local_48.width = local_58;
      local_48.height = dStack_50;
      pVar24 = convertToCanvas(this,(point *)&local_98,&local_48);
      local_60 = pVar24.x;
      local_48.width = local_58;
      local_48.height = dStack_50;
      local_98.width = dVar22;
      local_98.height = dVar2;
      pVar24 = convertToCanvas(this,(point *)&local_98,&local_48);
      iVar19 = (int)local_60;
      iVar20 = (int)pVar24.y + local_7c;
      dVar3 = (this->rangeX).max;
      dVar4 = (this->rangeX).min;
      dVar5 = _canvasSize->width;
      dVar6 = (this->rangeY).max;
      dVar7 = (this->rangeY).min;
      dVar8 = _canvasSize->height;
      poVar12 = std::operator<<(os,"<p:cxnSp><p:nvCxnSpPr><p:cNvPr id=\"");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12,"\" name=\"LineArrow");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::operator<<(poVar12,
                      "\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{B606E735-2B9E-47D5-A972-698E782DD359}\"/></a:ext></a:extLst></p:cNvPr><p:cNvCxnSpPr/><p:nvPr/></p:nvCxnSpPr>"
                     );
      poVar12 = std::operator<<(os,"<p:spPr><a:xfrm flipV=\"1\"><a:off x=\"");
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar19 + iVar17);
      poVar12 = std::operator<<(poVar12,"\" y=\"");
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar20);
      poVar12 = std::operator<<(poVar12,"\"/><a:ext cx=\"");
      poVar12 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)poVar12,
                           (int)(((dVar22 - dVar23) / (dVar3 - dVar4)) * 360000.0 * dVar5));
      poVar12 = std::operator<<(poVar12,"\" cy=\"");
      os = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar12,
                      (int)(((dVar2 - dVar1) / (dVar6 - dVar7)) * 360000.0 * dVar8));
      pcVar18 = 
      "\"/></a:xfrm><a:prstGeom prst=\"straightConnector1\"><a:avLst/></a:prstGeom><a:ln><a:tailEnd type=\"triangle\"/></a:ln></p:spPr><p:style><a:lnRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:lnRef><a:fillRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"tx1\"/></a:fontRef></p:style></p:cxnSp>"
      ;
      goto LAB_00103ad6;
    }
    if (oVar9 != OBJECT_CURVES) {
      return;
    }
  }
  poVar12 = std::operator<<(os,"<p:sp><p:nvSpPr><p:cNvPr id=\"");
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::operator<<(poVar12,
                  "\" name=\"qqqqqqqqq\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{29FFCF3D-8F32-482F-B193-ACC1CF50B0FA}\"/></a:ext></a:extLst></p:cNvPr><p:cNvSpPr/><p:nvPr/></p:nvSpPr>"
                 );
  poVar12 = std::operator<<(os,"<p:spPr><a:xfrm><a:off x=\"");
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar17);
  poVar12 = std::operator<<(poVar12,"\" y=\"");
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar19);
  poVar12 = std::operator<<(poVar12,"\"/>");
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<(os,"<a:ext cx=\"");
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar20);
  poVar12 = std::operator<<(poVar12,"\" cy=\"");
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar21);
  poVar12 = std::operator<<(poVar12,"\"/>");
  poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<(poVar12,"</a:xfrm><a:custGeom><a:avLst/><a:gdLst>");
  std::endl<char,std::char_traits<char>>(poVar12);
  local_78 = (double)iVar20;
  dStack_70 = (double)iVar21;
  lVar16 = 0;
  for (uVar15 = 0;
      p_Var10 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(this->points).super__Vector_base<_point,_std::allocator<_point>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)p_Var10 >> 4);
      uVar15 = uVar15 + 1) {
    local_98.width = local_78;
    local_98.height = dStack_70;
    pVar24 = convertToCanvas(this,(point *)((long)&p_Var10->x + lVar16),&local_98);
    poVar12 = std::operator<<(os,"<a:gd name=\"connsiteX");
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,"\"  fmla=\"*/ ");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.x);
    poVar12 = std::operator<<(poVar12," w ");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar20);
    poVar12 = std::operator<<(poVar12,"\"/>");
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(os,"<a:gd name=\"connsiteY");
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,"\"  fmla=\"*/ ");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.y);
    poVar12 = std::operator<<(poVar12," h ");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar21);
    poVar12 = std::operator<<(poVar12,"\"/>");
    std::endl<char,std::char_traits<char>>(poVar12);
    lVar16 = lVar16 + 0x10;
  }
  if (this->type == OBJECT_CLOSEDLINE) {
    poVar12 = std::operator<<(os,"<a:gd name=\"connsiteX");
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,"\"  fmla=\"*/ ");
    poVar12 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)poVar12,
                         (int)((this->points).super__Vector_base<_point,_std::allocator<_point>_>.
                               _M_impl.super__Vector_impl_data._M_start)->x);
    poVar12 = std::operator<<(poVar12," w ");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar20);
    poVar12 = std::operator<<(poVar12,"\"/>");
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(os,"<a:gd name=\"connsiteY");
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,"\"  fmla=\"*/ ");
    poVar12 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)poVar12,
                         (int)((this->points).super__Vector_base<_point,_std::allocator<_point>_>.
                               _M_impl.super__Vector_impl_data._M_start)->y);
    poVar12 = std::operator<<(poVar12," h ");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar21);
    poVar12 = std::operator<<(poVar12,"\"/>");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  poVar12 = std::operator<<(os,"</a:gdLst><a:ahLst/><a:cxnLst>");
  std::endl<char,std::char_traits<char>>(poVar12);
  for (uVar15 = 0;
      figurePoint = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                    super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(this->points).super__Vector_base<_point,_std::allocator<_point>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)figurePoint >> 4);
      uVar15 = uVar15 + 1) {
    poVar12 = std::operator<<(os,"<a:cxn ang=\"0\">");
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(os,"<a:pos x=\"connsiteX");
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,"\" y=\"connsiteY");
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,"\"/>");
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(os,"</a:cxn>");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  if (this->type == OBJECT_CLOSEDLINE) {
    poVar12 = std::operator<<(os,"<a:cxn ang=\"0\">");
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(os,"<a:pos x=\"connsiteX");
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,"\" y=\"connsiteY");
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,"\"/>");
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(os,"</a:cxn>");
    std::endl<char,std::char_traits<char>>(poVar12);
    figurePoint = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_98.width = local_78;
  local_98.height = dStack_70;
  pVar24 = convertToCanvas(this,figurePoint,&local_98);
  poVar12 = std::operator<<(os,"</a:cxnLst><a:rect l=\"l\" t=\"t\" r=\"r\" b=\"b\"/><a:pathLst>");
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<(os,"<a:path w=\"");
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar20);
  poVar12 = std::operator<<(poVar12,"\" h=\"");
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,iVar21);
  poVar12 = std::operator<<(poVar12,"\">");
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<(os,"<a:moveTo>");
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<(os,"<a:pt x=\"");
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.x);
  poVar12 = std::operator<<(poVar12,"\" y=\"");
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.y);
  poVar12 = std::operator<<(poVar12,"\"/>");
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<(os,"</a:moveTo>");
  std::endl<char,std::char_traits<char>>(poVar12);
  pbVar11 = (this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pbVar14 = (this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar11; pbVar14 = pbVar14 + 1
      ) {
    poVar12 = std::operator<<(os,"<a:cubicBezTo>");
    std::endl<char,std::char_traits<char>>(poVar12);
    for (lVar16 = 0; lVar16 != 0x30; lVar16 = lVar16 + 0x10) {
      local_98.width = local_78;
      local_98.height = dStack_70;
      pVar24 = convertToCanvas(this,(point *)((long)&pbVar14->pt[0].x + lVar16),&local_98);
      poVar12 = std::operator<<(os,"<a:pt x=\"");
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.x);
      poVar12 = std::operator<<(poVar12,"\" y=\"");
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.y);
      poVar12 = std::operator<<(poVar12,"\"/>");
      std::endl<char,std::char_traits<char>>(poVar12);
    }
    poVar12 = std::operator<<(os,"</a:cubicBezTo>");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  if (this->type == OBJECT_CLOSEDLINE) {
    local_98.width = local_78;
    local_98.height = dStack_70;
    pVar24 = convertToCanvas(this,(this->points).super__Vector_base<_point,_std::allocator<_point>_>
                                  ._M_impl.super__Vector_impl_data._M_start,&local_98);
    poVar12 = std::operator<<(os,"<a:lnTo>");
    poVar12 = std::operator<<(poVar12,"<a:pt x=\"");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.x);
    poVar12 = std::operator<<(poVar12,"\" y=\"");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.y);
    poVar12 = std::operator<<(poVar12,"\"/>");
    poVar12 = std::operator<<(poVar12,"</a:lnTo>");
    poVar12 = std::operator<<(poVar12,"<a:lnTo>");
    poVar12 = std::operator<<(poVar12,"<a:pt x=\"");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.x);
    poVar12 = std::operator<<(poVar12,"\" y=\"");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,(int)pVar24.y);
    poVar12 = std::operator<<(poVar12,"\"/>");
    poVar12 = std::operator<<(poVar12,"</a:lnTo>");
    std::operator<<(poVar12,"<a:close/>");
    pcVar18 = "</a:custGeom><a:solidFill><a:schemeClr val=\"accent1\"/></a:solidFill></p:spPr>";
  }
  else {
    pcVar18 = "</a:custGeom><a:noFill/></p:spPr>";
  }
  poVar12 = std::operator<<(os,"</a:path>");
  poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<(poVar12,"</a:pathLst>");
  poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<(poVar12,pcVar18);
  std::endl<char,std::char_traits<char>>(poVar12);
  pcVar18 = 
  "<p:style><a:lnRef idx=\"2\"><a:schemeClr val=\"accent1\"><a:shade val=\"50000\"/></a:schemeClr></a:lnRef><a:fillRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"lt1\"/></a:fontRef></p:style><p:txBody><a:bodyPr rtlCol=\"0\" anchor=\"ctr\"/><a:lstStyle/><a:p><a:pPr algn=\"ctr\"/><a:endParaRPr kumimoji=\"1\" lang=\"ja-JP\" altLang=\"en-US\"/></a:p></p:txBody></p:sp>"
  ;
LAB_00103ad6:
  std::operator<<(os,pcVar18);
  return;
}

Assistant:

void drawObject(std::ostream& os, unsigned int counter, const size& _canvasOffset, const size& _canvasSize) const
    {
        int canvasOffsetPPTXWidth = (int)(_canvasOffset.width * cm2pptx);
        int canvasOffsetPPTXHeight = (int)(_canvasOffset.height * cm2pptx);
        int canvasSizePPTXWidth = (int)(_canvasSize.width * cm2pptx);
        int canvasSizePPTXHeight = (int)(_canvasSize.height * cm2pptx);
        switch (type)
        {
        case OBJECT_CLOSEDLINE:
        case OBJECT_CURVES:
        {
            os << "<p:sp><p:nvSpPr><p:cNvPr id=\"" << counter << "\" name=\"qqqqqqqqq\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{29FFCF3D-8F32-482F-B193-ACC1CF50B0FA}\"/></a:ext></a:extLst></p:cNvPr><p:cNvSpPr/><p:nvPr/></p:nvSpPr>";
            os << "<p:spPr><a:xfrm><a:off x=\"" << canvasOffsetPPTXWidth << "\" y=\"" << canvasOffsetPPTXHeight << "\"/>" << std::endl;
            os << "<a:ext cx=\"" << canvasSizePPTXWidth << "\" cy=\"" << canvasSizePPTXHeight << "\"/>" << std::endl << "</a:xfrm><a:custGeom><a:avLst/><a:gdLst>" << std::endl;
            for (size_t i = 0; i < points.size(); i++)
            {
                point canvasPoint = convertToCanvas(points[i], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                os << "<a:gd name=\"connsiteX" << i << "\"  fmla=\"*/ " << (int)(canvasPoint.x) << " w " << canvasSizePPTXWidth << "\"/>" << std::endl;
                os << "<a:gd name=\"connsiteY" << i << "\"  fmla=\"*/ " << (int)(canvasPoint.y) << " h " << canvasSizePPTXHeight << "\"/>" << std::endl;
            }
            if (type == OBJECT_CLOSEDLINE)
            {
                size_t index = points.size();
                os << "<a:gd name=\"connsiteX" << index << "\"  fmla=\"*/ " << (int)(points[0].x) << " w " << canvasSizePPTXWidth << "\"/>" << std::endl;
                os << "<a:gd name=\"connsiteY" << index << "\"  fmla=\"*/ " << (int)(points[0].y) << " h " << canvasSizePPTXHeight << "\"/>" << std::endl;
            }
            os << "</a:gdLst><a:ahLst/><a:cxnLst>" << std::endl;
            for (size_t i = 0; i < points.size(); i++)
            {
                os << "<a:cxn ang=\"0\">" << std::endl;
                os << "<a:pos x=\"connsiteX" << i << "\" y=\"connsiteY" << i << "\"/>" << std::endl;
                os << "</a:cxn>" << std::endl;
            }
            if (type == OBJECT_CLOSEDLINE)
            {
                size_t index = points.size();
                os << "<a:cxn ang=\"0\">" << std::endl;
                os << "<a:pos x=\"connsiteX" << index << "\" y=\"connsiteY" << index << "\"/>" << std::endl;
                os << "</a:cxn>" << std::endl;
            }
            {
                point canvasPointStart = convertToCanvas(points[0], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                os << "</a:cxnLst><a:rect l=\"l\" t=\"t\" r=\"r\" b=\"b\"/><a:pathLst>" << std::endl;
                os << "<a:path w=\"" << canvasSizePPTXWidth << "\" h=\"" << canvasSizePPTXHeight << "\">" << std::endl;
                os << "<a:moveTo>" << std::endl;
                os << "<a:pt x=\"" << (int)(canvasPointStart.x) << "\" y=\"" << (int)(canvasPointStart.y) << "\"/>" << std::endl;
                os << "</a:moveTo>" << std::endl;
            }
            for (auto&& it : curves)
            {
                os << "<a:cubicBezTo>" << std::endl;
                for (size_t i = 0; i < 3; i++)
                {
                    point canvasPoint = convertToCanvas(it.pt[i], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                    os << "<a:pt x=\"" << (int)(canvasPoint.x) << "\" y=\"" << (int)(canvasPoint.y) << "\"/>" << std::endl;
                }
                os << "</a:cubicBezTo>" << std::endl;
            }
            if (type == OBJECT_CLOSEDLINE)
            {
                point canvasPoint = convertToCanvas(points[0], size(canvasSizePPTXWidth, canvasSizePPTXHeight));
                os << "<a:lnTo>"
                    << "<a:pt x=\"" << (int)(canvasPoint.x) << "\" y=\"" << (int)(canvasPoint.y) << "\"/>"
                    << "</a:lnTo>"
                    << "<a:lnTo>"
                    << "<a:pt x=\"" << (int)(canvasPoint.x) << "\" y=\"" << (int)(canvasPoint.y) << "\"/>"
                    << "</a:lnTo>"
                    << "<a:close/>";
                os << "</a:path>" << std::endl << "</a:pathLst>" << std::endl << "</a:custGeom><a:solidFill><a:schemeClr val=\"accent1\"/></a:solidFill></p:spPr>" << std::endl;

            }
            else
            {
                os << "</a:path>" << std::endl << "</a:pathLst>" << std::endl << "</a:custGeom><a:noFill/></p:spPr>" << std::endl;
            }
            os << "<p:style><a:lnRef idx=\"2\"><a:schemeClr val=\"accent1\"><a:shade val=\"50000\"/></a:schemeClr></a:lnRef><a:fillRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"lt1\"/></a:fontRef></p:style><p:txBody><a:bodyPr rtlCol=\"0\" anchor=\"ctr\"/><a:lstStyle/><a:p><a:pPr algn=\"ctr\"/><a:endParaRPr kumimoji=\"1\" lang=\"ja-JP\" altLang=\"en-US\"/></a:p></p:txBody></p:sp>";
        }
        break;
        case OBJECT_STRAIGHTLINE:
        {
            double minX = points[0].x < points[1].x ? points[0].x : points[1].x;
            double maxX = points[1].x < points[0].x ? points[0].x : points[1].x;
            double minY = points[0].y < points[1].y ? points[0].y : points[1].y;
            double maxY = points[1].y < points[0].y ? points[0].y : points[1].y;
            point LB = convertToCanvas(point(minX, minY), size(canvasSizePPTXWidth, canvasSizePPTXHeight));
            point RT = convertToCanvas(point(maxX, maxY), size(canvasSizePPTXWidth, canvasSizePPTXHeight));
            int offsetX = (int)(LB.x) + canvasOffsetPPTXWidth;
            int offsetY = (int)(RT.y) + canvasOffsetPPTXHeight;
            int canvasWidth = (int)(((maxX - minX) / (rangeX.max - rangeX.min)) * cm2pptx * _canvasSize.width);
            int canvasHeight = (int)(((maxY - minY) / (rangeY.max - rangeY.min)) * cm2pptx * _canvasSize.height);

            os << "<p:cxnSp><p:nvCxnSpPr><p:cNvPr id=\"" << counter << "\" name=\"LineArrow" << counter << "\"><a:extLst><a:ext uri=\"{FF2B5EF4-FFF2-40B4-BE49-F238E27FC236}\"><a16:creationId xmlns:a16=\"http://schemas.microsoft.com/office/drawing/2014/main\" id=\"{B606E735-2B9E-47D5-A972-698E782DD359}\"/></a:ext></a:extLst></p:cNvPr><p:cNvCxnSpPr/><p:nvPr/></p:nvCxnSpPr>";
            os << "<p:spPr><a:xfrm flipV=\"1\"><a:off x=\"" << offsetX << "\" y=\"" << offsetY << "\"/><a:ext cx=\"" << canvasWidth << "\" cy=\"" << canvasHeight << "\"/></a:xfrm><a:prstGeom prst=\"straightConnector1\"><a:avLst/></a:prstGeom><a:ln><a:tailEnd type=\"triangle\"/></a:ln></p:spPr><p:style><a:lnRef idx=\"1\"><a:schemeClr val=\"accent1\"/></a:lnRef><a:fillRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:fillRef><a:effectRef idx=\"0\"><a:schemeClr val=\"accent1\"/></a:effectRef><a:fontRef idx=\"minor\"><a:schemeClr val=\"tx1\"/></a:fontRef></p:style></p:cxnSp>";
        }
        break;
        default:
            break;
        }
    }